

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O1

bool fs_is_char_device(string_view path)

{
  char cVar1;
  bool bVar2;
  error_code ec;
  error_code local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  path local_40;
  
  local_60._M_value = 0;
  local_60._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&local_50,auto_format);
  cVar1 = std::filesystem::status(&local_40,&local_60);
  bVar2 = local_60._M_value == 0;
  std::filesystem::__cxx11::path::~path(&local_40);
  return bVar2 && cVar1 == '\x05';
}

Assistant:

bool fs_is_char_device(std::string_view path)
{
// character device like /dev/null or CONIN$

  bool ok;
#if defined(_WIN32)
// currently broken in MSVC STL and MinGW Clang ARM for <filesystem>
  ok = fs_win32_is_type(path, FILE_TYPE_CHAR);
#elif defined(HAVE_CXX_FILESYSTEM)
  std::error_code ec;
  ok = std::filesystem::is_character_file(path, ec) && !ec;
#else
  // Windows: https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/fstat-fstat32-fstat64-fstati64-fstat32i64-fstat64i32
  ok = S_ISCHR(fs_st_mode(path));
#endif

  return ok;
}